

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.hxx
# Opt level: O2

int system(char *__command)

{
  FILE *__stream;
  char *pcVar1;
  undefined8 *in_RSI;
  char result [24];
  
  *(char **)__command = __command + 0x10;
  __command[8] = '\0';
  __command[9] = '\0';
  __command[10] = '\0';
  __command[0xb] = '\0';
  __command[0xc] = '\0';
  __command[0xd] = '\0';
  __command[0xe] = '\0';
  __command[0xf] = '\0';
  __command[0x10] = '\0';
  __stream = popen((char *)*in_RSI,"r");
  result[0] = '\0';
  result[1] = '\0';
  result[2] = '\0';
  result[3] = '\0';
  result[4] = '\0';
  result[5] = '\0';
  result[6] = '\0';
  result[7] = '\0';
  result[8] = '\0';
  result[9] = '\0';
  result[10] = '\0';
  result[0xb] = '\0';
  result[0xc] = '\0';
  result[0xd] = '\0';
  result[0xe] = '\0';
  result[0xf] = '\0';
  result[0x10] = '\0';
  result[0x11] = '\0';
  result[0x12] = '\0';
  result[0x13] = '\0';
  result[0x14] = '\0';
  result[0x15] = '\0';
  result[0x16] = '\0';
  result[0x17] = '\0';
  while( true ) {
    pcVar1 = fgets(result,0x18,__stream);
    if (pcVar1 == (char *)0x0) break;
    std::__cxx11::string::append(__command);
  }
  pclose(__stream);
  return (int)__command;
}

Assistant:

static inline string system(const string & command)
{
  string coutput;
  FILE *cmd = popen(command.c_str(), "r");
  char result[24] = { 0x0 };
  while (fgets(result, sizeof(result), cmd) != NULL)
    coutput += result;
  pclose(cmd);
  return coutput;
}